

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneDiffer.cpp
# Opt level: O0

string * __thiscall
Assimp::dumpVector3_abi_cxx11_(string *__return_storage_ptr__,Assimp *this,aiVector3D *toDump)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream stream;
  ostream local_190 [376];
  Assimp *local_18;
  aiVector3D *toDump_local;
  
  local_18 = this;
  toDump_local = (aiVector3D *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"( ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)local_18);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(local_18 + 4));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(local_18 + 8));
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string dumpVector3( const aiVector3D &toDump ) {
    std::stringstream stream;
    stream << "( " << toDump.x << ", " << toDump.y << ", " << toDump.z << ")";
    return stream.str();
}